

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmltree.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  stream *Input;
  ebml_context *Context;
  ebml_element *Element;
  int local_264;
  parsercontext p;
  tchar_t fileName [256];
  
  if (argc == 2) {
    ParserContext_Init(&p,(nodemeta *)0x0,(cc_memheap *)0x0,(cc_memheap *)0x0);
    EBML_Init(&p);
    Node_FromStr(&p,fileName,0x100,argv[1]);
    Input = StreamOpen(&p,fileName,1);
    if (Input == (stream *)0x0) {
      fprintf(_stderr,"error: ebmltree cannot open file \"%s\"\r\n",argv[1]);
    }
    else {
      Context = EBML_getContextHead();
      Element = EBML_ElementCreate(Input,Context,0,-1);
      if (Element != (ebml_element *)0x0) {
        local_264 = -1;
        OutputElement(Element,(ebml_parser_context *)0x0,Input,&local_264);
        NodeDelete((node *)Element);
      }
      StreamClose(Input);
    }
    ParserContext_Done(&p);
    iVar1 = 0;
  }
  else {
    fwrite("Usage: ebmltree [ebml_file]\r\n",0x1d,1,_stderr);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, const char *argv[])
{
    parsercontext p;
    struct stream *Input;

    if (argc != 2)
    {
        fprintf(stderr, "Usage: ebmltree [ebml_file]\r\n");
        return 1;
    }

    // Core-C init phase
    ParserContext_Init(&p,NULL,NULL,NULL);
    // EBML Init
    EBML_Init(&p);

    // open the file to parse
    tchar_t fileName[MAXPATH];
    Node_FromStr(&p, fileName, TSIZEOF(fileName), argv[1]);
    Input = StreamOpen(&p,fileName,SFLAG_RDONLY);
    if (Input == NULL)
        fprintf(stderr, "error: ebmltree cannot open file \"%s\"\r\n",argv[1]);
    else
    {
        OutputTree(Input);

        StreamClose(Input);
    }

    // Core-C ending
    ParserContext_Done(&p);

    return 0;
}